

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> * __thiscall
draco::Decoder::DecodeMeshFromBuffer(Decoder *this,DecoderBuffer *in_buffer)

{
  bool bVar1;
  Mesh *in_RDI;
  Status _local_status;
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> mesh;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar2;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *this_00;
  Mesh *this_01;
  Status local_58;
  
  this_01 = in_RDI;
  operator_new(0xd8);
  Mesh::Mesh(this_01);
  this_00 = (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
            &stack0xffffffffffffffe0;
  std::unique_ptr<draco::Mesh,std::default_delete<draco::Mesh>>::
  unique_ptr<std::default_delete<draco::Mesh>,void>
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)this_00,
             (pointer)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::get
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)this_00);
  DecodeBufferToGeometry
            (this,in_buffer,
             (Mesh *)mesh._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>
                     ._M_t.super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
                     super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl);
  bVar1 = Status::ok(&local_58);
  uVar2 = bVar1;
  if (!bVar1) {
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              (this_00,(Status *)CONCAT17(bVar1,in_stack_ffffffffffffff68));
  }
  Status::~Status((Status *)0x153c0c);
  if (bVar1) {
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              (this_00,(unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                       CONCAT17(uVar2,in_stack_ffffffffffffff68));
  }
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::~unique_ptr
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)this_01);
  return (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)in_RDI;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> Decoder::DecodeMeshFromBuffer(
    DecoderBuffer *in_buffer) {
  std::unique_ptr<Mesh> mesh(new Mesh());
  DRACO_RETURN_IF_ERROR(DecodeBufferToGeometry(in_buffer, mesh.get()))
  return std::move(mesh);
}